

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_thread.c
# Opt level: O1

nhr_mutex nhr_mutex_create_recursive(void)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  pthread_mutexattr_t attr;
  pthread_mutexattr_t local_1c;
  
  __mutex = (pthread_mutex_t *)nhr_malloc_zero(0x28);
  iVar1 = pthread_mutexattr_init(&local_1c);
  if (iVar1 == 0) {
    iVar1 = pthread_mutexattr_settype(&local_1c,1);
    if (iVar1 == 0) {
      iVar1 = pthread_mutex_init(__mutex,&local_1c);
      pthread_mutexattr_destroy(&local_1c);
      if (iVar1 == 0) {
        return __mutex;
      }
    }
    else {
      pthread_mutexattr_destroy(&local_1c);
    }
  }
  __assert_fail("res == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/src/nhr_thread.c"
                ,0xae,"nhr_mutex nhr_mutex_create_recursive(void)");
}

Assistant:

nhr_mutex nhr_mutex_create_recursive(void) {
#if defined(NHR_OS_WINDOWS)
	CRITICAL_SECTION * mutex = (CRITICAL_SECTION *)nhr_malloc_zero(sizeof(CRITICAL_SECTION));
	InitializeCriticalSection((LPCRITICAL_SECTION)mutex);
	return mutex;
#else
	pthread_mutex_t * mutex = (pthread_mutex_t *)nhr_malloc_zero(sizeof(pthread_mutex_t));
	int res = -1;
	pthread_mutexattr_t attr;
	if (pthread_mutexattr_init(&attr) == 0) {
		if (pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE) == 0) {
			res = pthread_mutex_init(mutex, &attr);
		}
		pthread_mutexattr_destroy(&attr);
	}
	assert(res == 0);
	return mutex;
#endif
}